

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vector.h
# Opt level: O2

bool __thiscall
wasm::analysis::Vector<wasm::RandomFullLattice>::joinAtIndex
          (Vector<wasm::RandomFullLattice> *this,Element *joinee,size_t i,Element *elem)

{
  bool bVar1;
  
  bVar1 = RandomFullLattice::join
                    (&this->lattice,
                     (joinee->
                     super__Vector_base<wasm::RandomElement<wasm::RandomFullLattice>,_std::allocator<wasm::RandomElement<wasm::RandomFullLattice>_>_>
                     )._M_impl.super__Vector_impl_data._M_start + i,elem);
  return bVar1;
}

Assistant:

bool joinAtIndex(Element& joinee,
                   size_t i,
                   const typename L::Element& elem) const noexcept {
    if constexpr (std::is_same_v<typename L::Element, bool>) {
      // The vector<bool> specialization does not expose references to the
      // individual bools because they might be in a bitmap, so we need a
      // workaround.
      bool e = joinee[i];
      if (lattice.join(e, elem)) {
        joinee[i] = e;
        return true;
      }
      return false;
    } else {
      return lattice.join(joinee[i], elem);
    }
  }